

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O1

void __thiscall
TPZBlockDiagonal<std::complex<float>_>::GetBlock
          (TPZBlockDiagonal<std::complex<float>_> *this,int64_t i,
          TPZFMatrix<std::complex<float>_> *block)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = (this->fBlockPos).fStore[i];
  lVar4 = (long)(this->fBlockSize).fStore[i];
  (*(block->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xe])(block,lVar4,lVar4);
  if (0 < lVar4) {
    lVar1 = lVar1 << 3;
    lVar3 = 0;
    do {
      lVar5 = 0;
      lVar2 = lVar1;
      do {
        if (((block->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar3) ||
           ((block->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        block->fElem
        [(block->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar5 + lVar3].
        _M_value = *(_ComplexT *)((long)&((this->fStorage).fStore)->_M_value + lVar2);
        lVar5 = lVar5 + 1;
        lVar2 = lVar2 + lVar4 * 8;
      } while (lVar4 != lVar5);
      lVar3 = lVar3 + 1;
      lVar1 = lVar1 + 8;
    } while (lVar3 != lVar4);
  }
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::GetBlock(int64_t i, TPZFMatrix<TVar> &block){
    int64_t firstpos = fBlockPos[i];
    int64_t bsize = fBlockSize[i];
    block.Redim(bsize,bsize);
    int64_t r,c;
    for(r=0; r<bsize; r++) {
        for(c=0; c<bsize; c++) {
            block(r,c) = fStorage[firstpos+r+bsize*c];
        }
    }
}